

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O2

void dPrint_CompCol_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  printf("\nCompCol matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  uVar1 = A->ncol;
  piVar2 = (int *)A->Store;
  lVar4 = *(long *)(piVar2 + 2);
  printf("nrow %d, ncol %d, nnz %ld\n",(ulong)(uint)A->nrow,(ulong)uVar1,(long)*piVar2);
  printf("nzval: ");
  lVar5 = (long)(int)uVar1;
  for (lVar3 = 0; lVar3 < *(int *)(*(long *)(piVar2 + 6) + lVar5 * 4); lVar3 = lVar3 + 1) {
    printf("%f  ",*(undefined8 *)(lVar4 + lVar3 * 8));
  }
  printf("\nrowind: ");
  for (lVar4 = 0; lVar4 < *(int *)(*(long *)(piVar2 + 6) + lVar5 * 4); lVar4 = lVar4 + 1) {
    printf("%ld  ",(long)*(int *)(*(long *)(piVar2 + 4) + lVar4 * 4));
  }
  printf("\ncolptr: ");
  for (lVar4 = 0; lVar4 <= lVar5; lVar4 = lVar4 + 1) {
    printf("%ld  ",(long)*(int *)(*(long *)(piVar2 + 6) + lVar4 * 4));
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
dPrint_CompCol_Matrix(char *what, SuperMatrix *A)
{
    NCformat     *Astore;
    register int_t i;
    register int n;
    double       *dp;
    
    printf("\nCompCol matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (NCformat *) A->Store;
    dp = (double *) Astore->nzval;
    printf("nrow %d, ncol %d, nnz %ld\n", (int)A->nrow, (int)A->ncol, (long)Astore->nnz);
    printf("nzval: ");
    for (i = 0; i < Astore->colptr[n]; ++i) printf("%f  ", dp[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->colptr[n]; ++i) printf("%ld  ", (long)Astore->rowind[i]);
    printf("\ncolptr: ");
    for (i = 0; i <= n; ++i) printf("%ld  ", (long)Astore->colptr[i]);
    printf("\n");
    fflush(stdout);
}